

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create.cpp
# Opt level: O0

bool __thiscall create::Create::isCliff(Create *this)

{
  bool bVar1;
  uint16_t uVar2;
  element_type *peVar3;
  element_type *peVar4;
  ostream *poVar5;
  bool local_99;
  undefined1 local_78 [24];
  undefined1 local_60 [24];
  undefined1 local_48 [32];
  undefined1 local_28 [24];
  Create *this_local;
  
  local_28._16_8_ = this;
  peVar3 = std::__shared_ptr_access<create::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<create::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )&this->data);
  bVar1 = Data::isValidPacketID(peVar3,'\t');
  if (bVar1) {
    peVar3 = std::__shared_ptr_access<create::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<create::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->data);
    bVar1 = Data::isValidPacketID(peVar3,'\n');
    if (bVar1) {
      peVar3 = std::__shared_ptr_access<create::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<create::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->data);
      bVar1 = Data::isValidPacketID(peVar3,'\v');
      if (bVar1) {
        peVar3 = std::__shared_ptr_access<create::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<create::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->data);
        bVar1 = Data::isValidPacketID(peVar3,'\f');
        if (bVar1) {
          peVar3 = std::__shared_ptr_access<create::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<create::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&this->data);
          Data::getPacket((Data *)local_28,(uint8_t)peVar3);
          peVar4 = std::
                   __shared_ptr_access<create::Packet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<create::Packet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_28);
          local_60[0x17] = 0;
          local_78[0x17] = 0;
          bVar1 = false;
          uVar2 = Packet::getData(peVar4);
          local_99 = true;
          if (uVar2 != 1) {
            peVar3 = std::
                     __shared_ptr_access<create::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<create::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&this->data);
            Data::getPacket((Data *)local_48,(uint8_t)peVar3);
            local_60[0x17] = 1;
            peVar4 = std::
                     __shared_ptr_access<create::Packet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<create::Packet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_48);
            uVar2 = Packet::getData(peVar4);
            local_99 = true;
            if (uVar2 != 1) {
              peVar3 = std::
                       __shared_ptr_access<create::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                       operator->((__shared_ptr_access<create::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&this->data);
              Data::getPacket((Data *)local_60,(uint8_t)peVar3);
              local_78[0x17] = 1;
              peVar4 = std::
                       __shared_ptr_access<create::Packet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<create::Packet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_60);
              uVar2 = Packet::getData(peVar4);
              local_99 = true;
              if (uVar2 != 1) {
                peVar3 = std::
                         __shared_ptr_access<create::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<create::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)&this->data);
                Data::getPacket((Data *)local_78,(uint8_t)peVar3);
                bVar1 = true;
                peVar4 = std::
                         __shared_ptr_access<create::Packet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<create::Packet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_78);
                uVar2 = Packet::getData(peVar4);
                local_99 = uVar2 == 1;
              }
            }
          }
          this_local._7_1_ = local_99;
          if (bVar1) {
            std::shared_ptr<create::Packet>::~shared_ptr((shared_ptr<create::Packet> *)local_78);
          }
          if ((local_78[0x17] & 1) != 0) {
            std::shared_ptr<create::Packet>::~shared_ptr((shared_ptr<create::Packet> *)local_60);
          }
          if ((local_60[0x17] & 1) != 0) {
            std::shared_ptr<create::Packet>::~shared_ptr((shared_ptr<create::Packet> *)local_48);
          }
          std::shared_ptr<create::Packet>::~shared_ptr((shared_ptr<create::Packet> *)local_28);
          goto LAB_001a151d;
        }
      }
    }
  }
  poVar5 = std::operator<<((ostream *)&std::cerr,"[create::Create] ");
  poVar5 = std::operator<<(poVar5,"Cliff sensors not supported!");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  this_local._7_1_ = 0;
LAB_001a151d:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Create::isCliff() const {
    if (data->isValidPacketID(ID_CLIFF_LEFT) &&
        data->isValidPacketID(ID_CLIFF_FRONT_LEFT) &&
        data->isValidPacketID(ID_CLIFF_FRONT_RIGHT) &&
        data->isValidPacketID(ID_CLIFF_RIGHT)) {
      return GET_DATA(ID_CLIFF_LEFT) == 1 ||
             GET_DATA(ID_CLIFF_FRONT_LEFT) == 1 ||
             GET_DATA(ID_CLIFF_FRONT_RIGHT) == 1 ||
             GET_DATA(ID_CLIFF_RIGHT) == 1;
    }
    else {
      CERR("[create::Create] ", "Cliff sensors not supported!");
      return false;
    }
  }